

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  bool bVar10;
  int iVar11;
  AABBNodeMB4D *node1;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  vint4 ai;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar66 [64];
  uint uVar71;
  uint uVar72;
  uint uVar73;
  undefined1 auVar70 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [32];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9b0 [16];
  float local_9a0 [4];
  undefined1 local_990 [16];
  float local_980 [4];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar25 = local_7f8;
  local_800 = root.ptr;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_a80._4_4_ = fVar2;
  local_a80._0_4_ = fVar2;
  local_a80._8_4_ = fVar2;
  local_a80._12_4_ = fVar2;
  auVar52 = ZEXT1664(local_a80);
  fVar62 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a90._4_4_ = fVar62;
  local_a90._0_4_ = fVar62;
  local_a90._8_4_ = fVar62;
  local_a90._12_4_ = fVar62;
  auVar56 = ZEXT1664(local_a90);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar67 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_aa0._4_4_ = fVar67;
  local_aa0._0_4_ = fVar67;
  local_aa0._8_4_ = fVar67;
  local_aa0._12_4_ = fVar67;
  auVar57 = ZEXT1664(local_aa0);
  fVar62 = fVar62 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar67 = fVar67 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_a70._8_4_ = 0x80000000;
  local_a70._0_8_ = 0x8000000080000000;
  local_a70._12_4_ = 0x80000000;
  local_ab0._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_ab0._8_4_ = -fVar2;
  local_ab0._12_4_ = -fVar2;
  auVar61 = ZEXT1664(local_ab0);
  local_ac0._0_8_ = CONCAT44(fVar62,fVar62) ^ 0x8000000080000000;
  local_ac0._8_4_ = -fVar62;
  local_ac0._12_4_ = -fVar62;
  auVar66 = ZEXT1664(local_ac0);
  local_ad0._0_8_ = CONCAT44(fVar67,fVar67) ^ 0x8000000080000000;
  local_ad0._8_4_ = -fVar67;
  local_ad0._12_4_ = -fVar67;
  auVar70 = ZEXT1664(local_ad0);
  iVar11 = (tray->tnear).field_0.i[k];
  local_ae0._4_4_ = iVar11;
  local_ae0._0_4_ = iVar11;
  local_ae0._8_4_ = iVar11;
  local_ae0._12_4_ = iVar11;
  auVar75 = ZEXT1664(local_ae0);
  iVar11 = (tray->tfar).field_0.i[k];
  local_af0._4_4_ = iVar11;
  local_af0._0_4_ = iVar11;
  local_af0._8_4_ = iVar11;
  local_af0._12_4_ = iVar11;
  auVar77 = ZEXT1664(local_af0);
  iVar11 = 1 << ((uint)k & 0x1f);
  auVar41._4_4_ = iVar11;
  auVar41._0_4_ = iVar11;
  auVar41._8_4_ = iVar11;
  auVar41._12_4_ = iVar11;
  auVar41._16_4_ = iVar11;
  auVar41._20_4_ = iVar11;
  auVar41._24_4_ = iVar11;
  auVar41._28_4_ = iVar11;
  auVar9 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar41 = vpand_avx2(auVar41,auVar9);
  local_940 = vpcmpeqd_avx2(auVar41,auVar9);
  bVar10 = true;
  do {
    uVar32 = puVar25[-1];
    puVar25 = puVar25 + -1;
    while ((uVar32 & 8) == 0) {
      uVar12 = uVar32 & 0xfffffffffffffff0;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar34._4_4_ = uVar3;
      auVar34._0_4_ = uVar3;
      auVar34._8_4_ = uVar3;
      auVar34._12_4_ = uVar3;
      auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar28),auVar34,
                                *(undefined1 (*) [16])(uVar12 + 0x20 + uVar28));
      auVar35 = vfmadd213ps_fma(auVar35,auVar52._0_16_,auVar61._0_16_);
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar30),auVar34,
                                *(undefined1 (*) [16])(uVar12 + 0x20 + uVar30));
      auVar40 = vfmadd213ps_fma(auVar40,auVar56._0_16_,auVar66._0_16_);
      auVar35 = vpmaxsd_avx(auVar35,auVar40);
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + uVar22),auVar34,
                                *(undefined1 (*) [16])(uVar12 + 0x20 + uVar22));
      auVar40 = vfmadd213ps_fma(auVar40,auVar57._0_16_,auVar70._0_16_);
      auVar40 = vpmaxsd_avx(auVar40,auVar75._0_16_);
      auVar35 = vpmaxsd_avx(auVar35,auVar40);
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar28 ^ 0x10)),auVar34,
                                *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar28 ^ 0x10)));
      auVar40 = vfmadd213ps_fma(auVar40,auVar52._0_16_,auVar61._0_16_);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar30 ^ 0x10)),auVar34,
                                *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar30 ^ 0x10)));
      auVar36 = vfmadd213ps_fma(auVar36,auVar56._0_16_,auVar66._0_16_);
      auVar40 = vpminsd_avx(auVar40,auVar36);
      auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar12 + 0x80 + (uVar22 ^ 0x10)),auVar34,
                                *(undefined1 (*) [16])(uVar12 + 0x20 + (uVar22 ^ 0x10)));
      auVar36 = vfmadd213ps_fma(auVar36,auVar57._0_16_,auVar70._0_16_);
      auVar36 = vpminsd_avx(auVar36,auVar77._0_16_);
      auVar40 = vpminsd_avx(auVar40,auVar36);
      if (((uint)uVar32 & 7) == 6) {
        auVar40 = vcmpps_avx(auVar35,auVar40,2);
        auVar35 = vcmpps_avx(*(undefined1 (*) [16])(uVar12 + 0xe0),auVar34,2);
        auVar36 = vcmpps_avx(auVar34,*(undefined1 (*) [16])(uVar12 + 0xf0),1);
        auVar35 = vandps_avx(auVar35,auVar36);
        auVar35 = vandps_avx(auVar35,auVar40);
      }
      else {
        auVar35 = vcmpps_avx(auVar35,auVar40,2);
      }
      auVar35 = vpslld_avx(auVar35,0x1f);
      uVar19 = vmovmskps_avx(auVar35);
      if (uVar19 == 0) goto joined_r0x005694b4;
      uVar19 = uVar19 & 0xff;
      lVar21 = 0;
      for (uVar32 = (ulong)uVar19; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar32 = *(ulong *)(uVar12 + lVar21 * 8);
      uVar19 = uVar19 - 1 & uVar19;
      uVar23 = (ulong)uVar19;
      if (uVar19 != 0) {
        *puVar25 = uVar32;
        lVar21 = 0;
        for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
          lVar21 = lVar21 + 1;
        }
        uVar19 = uVar19 - 1 & uVar19;
        uVar23 = (ulong)uVar19;
        bVar33 = uVar19 == 0;
        while( true ) {
          puVar25 = puVar25 + 1;
          uVar32 = *(ulong *)(uVar12 + lVar21 * 8);
          if (bVar33) break;
          *puVar25 = uVar32;
          lVar21 = 0;
          for (uVar32 = uVar23; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
            lVar21 = lVar21 + 1;
          }
          uVar23 = uVar23 - 1 & uVar23;
          bVar33 = uVar23 == 0;
        }
      }
    }
    uVar12 = (ulong)((uint)uVar32 & 0xf);
    if (uVar12 != 8) {
      uVar32 = uVar32 & 0xfffffffffffffff0;
      lVar21 = 0;
      do {
        lVar20 = lVar21 * 0x50;
        pSVar5 = context->scene;
        pGVar6 = (pSVar5->geometries).items[*(uint *)(uVar32 + 0x30 + lVar20)].ptr;
        fVar2 = (pGVar6->time_range).lower;
        fVar2 = pGVar6->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar2) / ((pGVar6->time_range).upper - fVar2));
        auVar35 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
        auVar35 = vminss_avx(auVar35,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
        auVar46 = vmaxss_avx(ZEXT816(0),auVar35);
        lVar13 = (long)(int)auVar46._0_4_ * 0x38;
        uVar31 = (ulong)*(uint *)(uVar32 + 4 + lVar20);
        lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar13);
        lVar13 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar13);
        auVar35 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar32 + lVar20) * 4);
        uVar24 = (ulong)*(uint *)(uVar32 + 0x10 + lVar20);
        auVar40 = *(undefined1 (*) [16])(lVar7 + uVar24 * 4);
        uVar23 = (ulong)*(uint *)(uVar32 + 0x20 + lVar20);
        auVar45 = *(undefined1 (*) [16])(lVar7 + uVar23 * 4);
        auVar36 = *(undefined1 (*) [16])(lVar7 + uVar31 * 4);
        uVar14 = (ulong)*(uint *)(uVar32 + 0x14 + lVar20);
        auVar34 = *(undefined1 (*) [16])(lVar7 + uVar14 * 4);
        uVar15 = (ulong)*(uint *)(uVar32 + 0x24 + lVar20);
        auVar49 = *(undefined1 (*) [16])(lVar7 + uVar15 * 4);
        uVar29 = (ulong)*(uint *)(uVar32 + 8 + lVar20);
        auVar42 = *(undefined1 (*) [16])(lVar7 + uVar29 * 4);
        uVar16 = (ulong)*(uint *)(uVar32 + 0x18 + lVar20);
        auVar59 = *(undefined1 (*) [16])(lVar7 + uVar16 * 4);
        uVar26 = (ulong)*(uint *)(uVar32 + 0x28 + lVar20);
        auVar43 = *(undefined1 (*) [16])(lVar7 + uVar26 * 4);
        uVar27 = (ulong)*(uint *)(uVar32 + 0xc + lVar20);
        auVar51 = *(undefined1 (*) [16])(lVar7 + uVar27 * 4);
        uVar17 = (ulong)*(uint *)(uVar32 + 0x1c + lVar20);
        auVar37 = *(undefined1 (*) [16])(lVar7 + uVar17 * 4);
        uVar18 = (ulong)*(uint *)(uVar32 + 0x2c + lVar20);
        auVar38 = *(undefined1 (*) [16])(lVar7 + uVar18 * 4);
        auVar39 = *(undefined1 (*) [16])(lVar13 + (ulong)*(uint *)(uVar32 + lVar20) * 4);
        auVar53 = *(undefined1 (*) [16])(lVar13 + uVar24 * 4);
        fVar2 = fVar2 - auVar46._0_4_;
        auVar46 = vunpcklps_avx(auVar35,auVar42);
        auVar42 = vunpckhps_avx(auVar35,auVar42);
        auVar48 = vunpcklps_avx(auVar36,auVar51);
        auVar36 = vunpckhps_avx(auVar36,auVar51);
        auVar35 = *(undefined1 (*) [16])(lVar13 + uVar31 * 4);
        local_a50 = vunpcklps_avx(auVar42,auVar36);
        auVar51 = vunpcklps_avx(auVar46,auVar48);
        auVar42 = vunpckhps_avx(auVar46,auVar48);
        auVar46 = vunpcklps_avx(auVar40,auVar59);
        auVar36 = vunpckhps_avx(auVar40,auVar59);
        auVar59 = vunpcklps_avx(auVar34,auVar37);
        auVar34 = vunpckhps_avx(auVar34,auVar37);
        auVar40 = *(undefined1 (*) [16])(lVar13 + uVar29 * 4);
        local_a40 = vunpcklps_avx(auVar36,auVar34);
        auVar37 = vunpcklps_avx(auVar46,auVar59);
        local_a60 = vunpckhps_avx(auVar46,auVar59);
        auVar46 = vunpcklps_avx(auVar45,auVar43);
        auVar34 = vunpckhps_avx(auVar45,auVar43);
        auVar43 = vunpcklps_avx(auVar49,auVar38);
        auVar59 = vunpckhps_avx(auVar49,auVar38);
        auVar36 = *(undefined1 (*) [16])(lVar13 + uVar27 * 4);
        auVar38 = vunpcklps_avx(auVar34,auVar59);
        auVar48 = vunpcklps_avx(auVar46,auVar43);
        local_a30 = vunpckhps_avx(auVar46,auVar43);
        auVar34 = vunpcklps_avx(auVar39,auVar40);
        auVar40 = vunpckhps_avx(auVar39,auVar40);
        auVar59 = vunpcklps_avx(auVar35,auVar36);
        auVar36 = vunpckhps_avx(auVar35,auVar36);
        auVar35 = *(undefined1 (*) [16])(lVar13 + uVar16 * 4);
        auVar43 = vunpcklps_avx(auVar40,auVar36);
        auVar39 = vunpcklps_avx(auVar34,auVar59);
        auVar36 = vunpckhps_avx(auVar34,auVar59);
        auVar59 = vunpcklps_avx(auVar53,auVar35);
        auVar34 = vunpckhps_avx(auVar53,auVar35);
        auVar35 = *(undefined1 (*) [16])(lVar13 + uVar14 * 4);
        auVar40 = *(undefined1 (*) [16])(lVar13 + uVar17 * 4);
        auVar53 = vunpcklps_avx(auVar35,auVar40);
        auVar35 = vunpckhps_avx(auVar35,auVar40);
        auVar46 = vunpcklps_avx(auVar34,auVar35);
        auVar45 = vunpcklps_avx(auVar59,auVar53);
        auVar34 = vunpckhps_avx(auVar59,auVar53);
        auVar35 = *(undefined1 (*) [16])(lVar13 + uVar23 * 4);
        auVar40 = *(undefined1 (*) [16])(lVar13 + uVar26 * 4);
        auVar53 = vunpcklps_avx(auVar35,auVar40);
        auVar59 = vunpckhps_avx(auVar35,auVar40);
        auVar35 = *(undefined1 (*) [16])(lVar13 + uVar15 * 4);
        auVar40 = *(undefined1 (*) [16])(lVar13 + uVar18 * 4);
        auVar49 = vunpcklps_avx(auVar35,auVar40);
        auVar35 = vunpckhps_avx(auVar35,auVar40);
        auVar40 = vunpcklps_avx(auVar59,auVar35);
        auVar59 = vunpcklps_avx(auVar53,auVar49);
        auVar35 = vunpckhps_avx(auVar53,auVar49);
        fVar62 = 1.0 - fVar2;
        auVar78._4_4_ = fVar62;
        auVar78._0_4_ = fVar62;
        auVar78._8_4_ = fVar62;
        auVar78._12_4_ = fVar62;
        auVar53._0_4_ = fVar2 * auVar39._0_4_;
        auVar53._4_4_ = fVar2 * auVar39._4_4_;
        auVar53._8_4_ = fVar2 * auVar39._8_4_;
        auVar53._12_4_ = fVar2 * auVar39._12_4_;
        auVar51 = vfmadd231ps_fma(auVar53,auVar78,auVar51);
        auVar58._0_4_ = fVar2 * auVar36._0_4_;
        auVar58._4_4_ = fVar2 * auVar36._4_4_;
        auVar58._8_4_ = fVar2 * auVar36._8_4_;
        auVar58._12_4_ = fVar2 * auVar36._12_4_;
        auVar39 = vfmadd231ps_fma(auVar58,auVar78,auVar42);
        auVar63._0_4_ = fVar2 * auVar43._0_4_;
        auVar63._4_4_ = fVar2 * auVar43._4_4_;
        auVar63._8_4_ = fVar2 * auVar43._8_4_;
        auVar63._12_4_ = fVar2 * auVar43._12_4_;
        auVar53 = vfmadd231ps_fma(auVar63,auVar78,local_a50);
        auVar36._0_4_ = fVar2 * auVar45._0_4_;
        auVar36._4_4_ = fVar2 * auVar45._4_4_;
        auVar36._8_4_ = fVar2 * auVar45._8_4_;
        auVar36._12_4_ = fVar2 * auVar45._12_4_;
        auVar36 = vfmadd231ps_fma(auVar36,auVar78,auVar37);
        auVar42._0_4_ = fVar2 * auVar34._0_4_;
        auVar42._4_4_ = fVar2 * auVar34._4_4_;
        auVar42._8_4_ = fVar2 * auVar34._8_4_;
        auVar42._12_4_ = fVar2 * auVar34._12_4_;
        auVar34 = vfmadd231ps_fma(auVar42,auVar78,local_a60);
        auVar45._0_4_ = fVar2 * auVar46._0_4_;
        auVar45._4_4_ = fVar2 * auVar46._4_4_;
        auVar45._8_4_ = fVar2 * auVar46._8_4_;
        auVar45._12_4_ = fVar2 * auVar46._12_4_;
        auVar42 = vfmadd231ps_fma(auVar45,auVar78,local_a40);
        puVar1 = (undefined8 *)(uVar32 + 0x30 + lVar20);
        local_a10 = *puVar1;
        uStack_a08 = puVar1[1];
        puVar1 = (undefined8 *)(uVar32 + 0x40 + lVar20);
        auVar49._0_4_ = fVar2 * auVar59._0_4_;
        auVar49._4_4_ = fVar2 * auVar59._4_4_;
        auVar49._8_4_ = fVar2 * auVar59._8_4_;
        auVar49._12_4_ = fVar2 * auVar59._12_4_;
        auVar74._0_4_ = fVar2 * auVar35._0_4_;
        auVar74._4_4_ = fVar2 * auVar35._4_4_;
        auVar74._8_4_ = fVar2 * auVar35._8_4_;
        auVar74._12_4_ = fVar2 * auVar35._12_4_;
        auVar80._0_4_ = fVar2 * auVar40._0_4_;
        auVar80._4_4_ = fVar2 * auVar40._4_4_;
        auVar80._8_4_ = fVar2 * auVar40._8_4_;
        auVar80._12_4_ = fVar2 * auVar40._12_4_;
        auVar59 = vfmadd231ps_fma(auVar49,auVar78,auVar48);
        auVar43 = vfmadd231ps_fma(auVar74,auVar78,local_a30);
        auVar37 = vfmadd231ps_fma(auVar80,auVar78,auVar38);
        local_a20 = *puVar1;
        uStack_a18 = puVar1[1];
        auVar40 = vsubps_avx(auVar51,auVar36);
        auVar35 = vsubps_avx(auVar39,auVar34);
        auVar36 = vsubps_avx(auVar53,auVar42);
        auVar34 = vsubps_avx(auVar59,auVar51);
        auVar42 = vsubps_avx(auVar43,auVar39);
        auVar59 = vsubps_avx(auVar37,auVar53);
        auVar43._0_4_ = auVar35._0_4_ * auVar59._0_4_;
        auVar43._4_4_ = auVar35._4_4_ * auVar59._4_4_;
        auVar43._8_4_ = auVar35._8_4_ * auVar59._8_4_;
        auVar43._12_4_ = auVar35._12_4_ * auVar59._12_4_;
        local_970 = vfmsub231ps_fma(auVar43,auVar42,auVar36);
        auVar48._0_4_ = auVar36._0_4_ * auVar34._0_4_;
        auVar48._4_4_ = auVar36._4_4_ * auVar34._4_4_;
        auVar48._8_4_ = auVar36._8_4_ * auVar34._8_4_;
        auVar48._12_4_ = auVar36._12_4_ * auVar34._12_4_;
        local_960 = vfmsub231ps_fma(auVar48,auVar59,auVar40);
        uVar3 = *(undefined4 *)(ray + k * 4);
        auVar46._4_4_ = uVar3;
        auVar46._0_4_ = uVar3;
        auVar46._8_4_ = uVar3;
        auVar46._12_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar50._4_4_ = uVar3;
        auVar50._0_4_ = uVar3;
        auVar50._8_4_ = uVar3;
        auVar50._12_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar37._4_4_ = uVar3;
        auVar37._0_4_ = uVar3;
        auVar37._8_4_ = uVar3;
        auVar37._12_4_ = uVar3;
        fVar2 = *(float *)(ray + k * 4 + 0x80);
        auVar79._4_4_ = fVar2;
        auVar79._0_4_ = fVar2;
        auVar79._8_4_ = fVar2;
        auVar79._12_4_ = fVar2;
        auVar43 = vsubps_avx(auVar51,auVar46);
        fVar62 = *(float *)(ray + k * 4 + 0xa0);
        auVar81._4_4_ = fVar62;
        auVar81._0_4_ = fVar62;
        auVar81._8_4_ = fVar62;
        auVar81._12_4_ = fVar62;
        auVar51 = vsubps_avx(auVar39,auVar50);
        fVar67 = *(float *)(ray + k * 4 + 0xc0);
        auVar82._4_4_ = fVar67;
        auVar82._0_4_ = fVar67;
        auVar82._8_4_ = fVar67;
        auVar82._12_4_ = fVar67;
        auVar37 = vsubps_avx(auVar53,auVar37);
        auVar38._0_4_ = fVar2 * auVar51._0_4_;
        auVar38._4_4_ = fVar2 * auVar51._4_4_;
        auVar38._8_4_ = fVar2 * auVar51._8_4_;
        auVar38._12_4_ = fVar2 * auVar51._12_4_;
        auVar38 = vfmsub231ps_fma(auVar38,auVar43,auVar81);
        auVar64._0_4_ = auVar59._0_4_ * auVar38._0_4_;
        auVar64._4_4_ = auVar59._4_4_ * auVar38._4_4_;
        auVar64._8_4_ = auVar59._8_4_ * auVar38._8_4_;
        auVar64._12_4_ = auVar59._12_4_ * auVar38._12_4_;
        auVar39._0_4_ = auVar36._0_4_ * auVar38._0_4_;
        auVar39._4_4_ = auVar36._4_4_ * auVar38._4_4_;
        auVar39._8_4_ = auVar36._8_4_ * auVar38._8_4_;
        auVar39._12_4_ = auVar36._12_4_ * auVar38._12_4_;
        auVar59._0_4_ = fVar67 * auVar43._0_4_;
        auVar59._4_4_ = fVar67 * auVar43._4_4_;
        auVar59._8_4_ = fVar67 * auVar43._8_4_;
        auVar59._12_4_ = fVar67 * auVar43._12_4_;
        auVar59 = vfmsub231ps_fma(auVar59,auVar37,auVar79);
        auVar36 = vfmadd231ps_fma(auVar64,auVar59,auVar42);
        auVar59 = vfmadd231ps_fma(auVar39,auVar35,auVar59);
        auVar60._0_4_ = auVar42._0_4_ * auVar40._0_4_;
        auVar60._4_4_ = auVar42._4_4_ * auVar40._4_4_;
        auVar60._8_4_ = auVar42._8_4_ * auVar40._8_4_;
        auVar60._12_4_ = auVar42._12_4_ * auVar40._12_4_;
        local_950 = vfmsub231ps_fma(auVar60,auVar34,auVar35);
        auVar35._0_4_ = fVar62 * auVar37._0_4_;
        auVar35._4_4_ = fVar62 * auVar37._4_4_;
        auVar35._8_4_ = fVar62 * auVar37._8_4_;
        auVar35._12_4_ = fVar62 * auVar37._12_4_;
        auVar38 = vfmsub231ps_fma(auVar35,auVar51,auVar82);
        auVar76._0_4_ = fVar67 * local_950._0_4_;
        auVar76._4_4_ = fVar67 * local_950._4_4_;
        auVar76._8_4_ = fVar67 * local_950._8_4_;
        auVar76._12_4_ = fVar67 * local_950._12_4_;
        auVar35 = vfmadd231ps_fma(auVar76,local_960,auVar81);
        auVar42 = vfmadd231ps_fma(auVar35,local_970,auVar79);
        auVar36 = vfmadd231ps_fma(auVar36,auVar38,auVar34);
        auVar35 = vandps_avx(auVar42,local_a70);
        uVar19 = auVar35._0_4_;
        local_a00._0_4_ = (float)(uVar19 ^ auVar36._0_4_);
        uVar71 = auVar35._4_4_;
        local_a00._4_4_ = (float)(uVar71 ^ auVar36._4_4_);
        uVar72 = auVar35._8_4_;
        local_a00._8_4_ = (float)(uVar72 ^ auVar36._8_4_);
        uVar73 = auVar35._12_4_;
        local_a00._12_4_ = (float)(uVar73 ^ auVar36._12_4_);
        auVar35 = vfmadd231ps_fma(auVar59,auVar40,auVar38);
        local_9f0._0_4_ = (float)(uVar19 ^ auVar35._0_4_);
        local_9f0._4_4_ = (float)(uVar71 ^ auVar35._4_4_);
        local_9f0._8_4_ = (float)(uVar72 ^ auVar35._8_4_);
        local_9f0._12_4_ = (float)(uVar73 ^ auVar35._12_4_);
        auVar36 = ZEXT816(0) << 0x20;
        auVar35 = vcmpps_avx(local_a00,auVar36,5);
        auVar40 = vcmpps_avx(local_9f0,auVar36,5);
        auVar35 = vandps_avx(auVar40,auVar35);
        auVar65._8_4_ = 0x7fffffff;
        auVar65._0_8_ = 0x7fffffff7fffffff;
        auVar65._12_4_ = 0x7fffffff;
        local_9d0 = vandps_avx(auVar42,auVar65);
        auVar40 = vcmpps_avx(auVar42,auVar36,4);
        auVar35 = vandps_avx(auVar40,auVar35);
        auVar40._0_4_ = local_a00._0_4_ + local_9f0._0_4_;
        auVar40._4_4_ = local_a00._4_4_ + local_9f0._4_4_;
        auVar40._8_4_ = local_a00._8_4_ + local_9f0._8_4_;
        auVar40._12_4_ = local_a00._12_4_ + local_9f0._12_4_;
        auVar40 = vcmpps_avx(auVar40,local_9d0,2);
        auVar36 = auVar40 & auVar35;
        if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar36[0xf] < '\0') {
          auVar35 = vandps_avx(auVar35,auVar40);
          auVar54._0_4_ = local_950._0_4_ * auVar37._0_4_;
          auVar54._4_4_ = local_950._4_4_ * auVar37._4_4_;
          auVar54._8_4_ = local_950._8_4_ * auVar37._8_4_;
          auVar54._12_4_ = local_950._12_4_ * auVar37._12_4_;
          auVar40 = vfmadd213ps_fma(auVar51,local_960,auVar54);
          auVar40 = vfmadd213ps_fma(auVar43,local_970,auVar40);
          local_9e0._0_4_ = (float)(uVar19 ^ auVar40._0_4_);
          local_9e0._4_4_ = (float)(uVar71 ^ auVar40._4_4_);
          local_9e0._8_4_ = (float)(uVar72 ^ auVar40._8_4_);
          local_9e0._12_4_ = (float)(uVar73 ^ auVar40._12_4_);
          fVar2 = *(float *)(ray + k * 4 + 0x60);
          auVar51._0_4_ = local_9d0._0_4_ * fVar2;
          auVar51._4_4_ = local_9d0._4_4_ * fVar2;
          auVar51._8_4_ = local_9d0._8_4_ * fVar2;
          auVar51._12_4_ = local_9d0._12_4_ * fVar2;
          auVar40 = vcmpps_avx(auVar51,local_9e0,1);
          fVar2 = *(float *)(ray + k * 4 + 0x100);
          auVar55._0_4_ = local_9d0._0_4_ * fVar2;
          auVar55._4_4_ = local_9d0._4_4_ * fVar2;
          auVar55._8_4_ = local_9d0._8_4_ * fVar2;
          auVar55._12_4_ = local_9d0._12_4_ * fVar2;
          auVar36 = vcmpps_avx(local_9e0,auVar55,2);
          auVar40 = vandps_avx(auVar40,auVar36);
          local_9b0 = vandps_avx(auVar40,auVar35);
          uVar19 = vmovmskps_avx(local_9b0);
          if (uVar19 != 0) {
            auVar35 = vrcpps_avx(local_9d0);
            auVar44._8_4_ = 0x3f800000;
            auVar44._0_8_ = 0x3f8000003f800000;
            auVar44._12_4_ = 0x3f800000;
            auVar40 = vfnmadd213ps_fma(local_9d0,auVar35,auVar44);
            auVar35 = vfmadd132ps_fma(auVar40,auVar35,auVar35);
            fVar62 = auVar35._0_4_;
            fVar67 = auVar35._4_4_;
            fVar68 = auVar35._8_4_;
            fVar69 = auVar35._12_4_;
            local_980[0] = fVar62 * local_9e0._0_4_;
            local_980[1] = fVar67 * local_9e0._4_4_;
            local_980[2] = fVar68 * local_9e0._8_4_;
            local_980[3] = fVar69 * local_9e0._12_4_;
            local_9a0[0] = fVar62 * local_a00._0_4_;
            local_9a0[1] = fVar67 * local_a00._4_4_;
            local_9a0[2] = fVar68 * local_a00._8_4_;
            local_9a0[3] = fVar69 * local_a00._12_4_;
            local_990._0_4_ = fVar62 * local_9f0._0_4_;
            local_990._4_4_ = fVar67 * local_9f0._4_4_;
            local_990._8_4_ = fVar68 * local_9f0._8_4_;
            local_990._12_4_ = fVar69 * local_9f0._12_4_;
            uVar23 = (ulong)(uVar19 & 0xff);
            do {
              uVar14 = 0;
              for (uVar15 = uVar23; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                uVar14 = uVar14 + 1;
              }
              uVar19 = *(uint *)((long)&local_a10 + uVar14 * 4);
              pGVar6 = (pSVar5->geometries).items[uVar19].ptr;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005694d8:
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                  return bVar10;
                }
                uVar15 = (ulong)(uint)((int)uVar14 * 4);
                uVar3 = *(undefined4 *)((long)local_9a0 + uVar15);
                local_8c0._4_4_ = uVar3;
                local_8c0._0_4_ = uVar3;
                local_8c0._8_4_ = uVar3;
                local_8c0._12_4_ = uVar3;
                local_8c0._16_4_ = uVar3;
                local_8c0._20_4_ = uVar3;
                local_8c0._24_4_ = uVar3;
                local_8c0._28_4_ = uVar3;
                local_8a0 = *(undefined4 *)(local_990 + uVar15);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_980 + uVar15);
                local_b50.context = context->user;
                uVar3 = *(undefined4 *)((long)&local_a20 + uVar15);
                local_880._4_4_ = uVar3;
                local_880._0_4_ = uVar3;
                local_880._8_4_ = uVar3;
                local_880._12_4_ = uVar3;
                local_880._16_4_ = uVar3;
                local_880._20_4_ = uVar3;
                local_880._24_4_ = uVar3;
                local_880._28_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_970 + uVar15);
                uVar4 = *(undefined4 *)(local_960 + uVar15);
                local_900._4_4_ = uVar4;
                local_900._0_4_ = uVar4;
                local_900._8_4_ = uVar4;
                local_900._12_4_ = uVar4;
                local_900._16_4_ = uVar4;
                local_900._20_4_ = uVar4;
                local_900._24_4_ = uVar4;
                local_900._28_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_950 + uVar15);
                local_8e0._4_4_ = uVar4;
                local_8e0._0_4_ = uVar4;
                local_8e0._8_4_ = uVar4;
                local_8e0._12_4_ = uVar4;
                local_8e0._16_4_ = uVar4;
                local_8e0._20_4_ = uVar4;
                local_8e0._24_4_ = uVar4;
                local_8e0._28_4_ = uVar4;
                local_860._4_4_ = uVar19;
                local_860._0_4_ = uVar19;
                local_860._8_4_ = uVar19;
                local_860._12_4_ = uVar19;
                local_860._16_4_ = uVar19;
                local_860._20_4_ = uVar19;
                local_860._24_4_ = uVar19;
                local_860._28_4_ = uVar19;
                local_920[0] = (RTCHitN)(char)uVar3;
                local_920[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[4] = (RTCHitN)(char)uVar3;
                local_920[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[8] = (RTCHitN)(char)uVar3;
                local_920[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0xc] = (RTCHitN)(char)uVar3;
                local_920[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x10] = (RTCHitN)(char)uVar3;
                local_920[0x11] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x14] = (RTCHitN)(char)uVar3;
                local_920[0x15] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x18] = (RTCHitN)(char)uVar3;
                local_920[0x19] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                local_920[0x1c] = (RTCHitN)(char)uVar3;
                local_920[0x1d] = (RTCHitN)(char)((uint)uVar3 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                uStack_89c = local_8a0;
                uStack_898 = local_8a0;
                uStack_894 = local_8a0;
                uStack_890 = local_8a0;
                uStack_88c = local_8a0;
                uStack_888 = local_8a0;
                uStack_884 = local_8a0;
                vpcmpeqd_avx2(local_8c0,local_8c0);
                uStack_83c = (local_b50.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_b50.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_b20 = local_940;
                local_b50.valid = (int *)local_b20;
                local_b50.geometryUserPtr = pGVar6->userPtr;
                local_b50.hit = local_920;
                local_b50.N = 8;
                local_b50.ray = (RTCRayN *)ray;
                if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar6->occlusionFilterN)(&local_b50);
                }
                auVar9 = vpcmpeqd_avx2(local_b20,_DAT_01faff00);
                auVar41 = _DAT_01fe9960 & ~auVar9;
                if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar41 >> 0x7f,0) == '\0') &&
                      (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar41 >> 0xbf,0) == '\0') &&
                    (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar41[0x1f]) {
                  auVar9 = auVar9 ^ _DAT_01fe9960;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var8)(&local_b50);
                  }
                  auVar41 = vpcmpeqd_avx2(local_b20,_DAT_01faff00);
                  auVar9 = auVar41 ^ _DAT_01fe9960;
                  auVar47._8_4_ = 0xff800000;
                  auVar47._0_8_ = 0xff800000ff800000;
                  auVar47._12_4_ = 0xff800000;
                  auVar47._16_4_ = 0xff800000;
                  auVar47._20_4_ = 0xff800000;
                  auVar47._24_4_ = 0xff800000;
                  auVar47._28_4_ = 0xff800000;
                  auVar41 = vblendvps_avx(auVar47,*(undefined1 (*) [32])(local_b50.ray + 0x100),
                                          auVar41);
                  *(undefined1 (*) [32])(local_b50.ray + 0x100) = auVar41;
                }
                if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar9 >> 0x7f,0) != '\0') ||
                      (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar9 >> 0xbf,0) != '\0') ||
                    (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar9[0x1f] < '\0') goto LAB_005694d8;
                *(float *)(ray + k * 4 + 0x100) = fVar2;
              }
              uVar23 = uVar23 ^ 1L << (uVar14 & 0x3f);
            } while (uVar23 != 0);
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != uVar12 - 8);
    }
    auVar52 = ZEXT1664(local_a80);
    auVar56 = ZEXT1664(local_a90);
    auVar57 = ZEXT1664(local_aa0);
    auVar61 = ZEXT1664(local_ab0);
    auVar66 = ZEXT1664(local_ac0);
    auVar70 = ZEXT1664(local_ad0);
    auVar75 = ZEXT1664(local_ae0);
    auVar77 = ZEXT1664(local_af0);
joined_r0x005694b4:
    bVar10 = puVar25 != &local_800;
    if (!bVar10) {
      return bVar10;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }